

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::AggressiveDCEPass::MarkFunctionParameterAsLive
          (AggressiveDCEPass *this,Function *func)

{
  anon_class_8_1_8991fb9c local_40;
  function<void_(const_spvtools::opt::Instruction_*)> local_38;
  Function *local_18;
  Function *func_local;
  AggressiveDCEPass *this_local;
  
  local_40.this = this;
  local_18 = func;
  func_local = (Function *)this;
  std::function<void(spvtools::opt::Instruction_const*)>::
  function<spvtools::opt::AggressiveDCEPass::MarkFunctionParameterAsLive(spvtools::opt::Function_const*)::__0,void>
            ((function<void(spvtools::opt::Instruction_const*)> *)&local_38,&local_40);
  opt::Function::ForEachParam(func,&local_38,false);
  std::function<void_(const_spvtools::opt::Instruction_*)>::~function(&local_38);
  return;
}

Assistant:

void AggressiveDCEPass::MarkFunctionParameterAsLive(const Function* func) {
  func->ForEachParam(
      [this](const Instruction* param) {
        AddToWorklist(const_cast<Instruction*>(param));
      },
      false);
}